

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handypack.hpp
# Opt level: O0

void NHandyPack::
     TVectorSerializer<std::vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>,_std::pair<unsigned_short,_unsigned_short>_>
     ::Load(istream *in,
           vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
           *object)

{
  pair<unsigned_short,_unsigned_short> local_2c;
  ulong uStack_28;
  pair<unsigned_short,_unsigned_short> obj;
  size_t i;
  vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
  *pvStack_18;
  uint32_t size;
  vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
  *object_local;
  istream *in_local;
  
  pvStack_18 = object;
  object_local = (vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                  *)in;
  std::istream::read((char *)in,(long)&i + 4);
  std::
  vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
  ::clear(pvStack_18);
  std::
  vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
  ::reserve(pvStack_18,(ulong)i._4_4_);
  for (uStack_28 = 0; uStack_28 < i._4_4_; uStack_28 = uStack_28 + 1) {
    std::pair<unsigned_short,_unsigned_short>::pair<unsigned_short,_unsigned_short,_true>(&local_2c)
    ;
    Load<std::pair<unsigned_short,unsigned_short>>((istream *)object_local,&local_2c);
    std::
    vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
    ::push_back(pvStack_18,&local_2c);
  }
  return;
}

Assistant:

static inline void Load(std::istream& in, TVec& object) {
        uint32_t size;
        in.read((char*)(&size), sizeof(size));
        object.clear();
        object.reserve(size);
        for (size_t i = 0; i < size; ++i) {
            TObj obj;
            NHandyPack::Load(in, obj);
            object.push_back(std::move(obj));
        }
    }